

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DisableStatementSyntax::setChild
          (DisableStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_008c18e4 + *(int *)(&DAT_008c18e4 + index * 4)))();
  return;
}

Assistant:

void DisableStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: disable = child.token(); return;
        case 3: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}